

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUuid.cxx
# Opt level: O0

bool __thiscall
cmUuid::StringToBinaryImpl
          (cmUuid *this,string *input,vector<unsigned_char,_std::allocator<unsigned_char>_> *output)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  char *pcVar4;
  byte local_33;
  byte local_32;
  char local_31;
  char c2;
  ulong uStack_30;
  char c1;
  size_t i;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *output_local;
  string *input_local;
  cmUuid *this_local;
  
  i = (size_t)output;
  output_local = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)input;
  input_local = (string *)this;
  uVar2 = std::__cxx11::string::size();
  if ((uVar2 & 1) == 0) {
    for (uStack_30 = 0; uVar2 = uStack_30, uVar3 = std::__cxx11::string::size(), uVar2 < uVar3;
        uStack_30 = uStack_30 + 2) {
      local_31 = '\0';
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)output_local);
      bVar1 = IntFromHexDigit(this,*pcVar4,&local_31);
      if (!bVar1) {
        return false;
      }
      local_32 = 0;
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)output_local);
      bVar1 = IntFromHexDigit(this,*pcVar4,(char *)&local_32);
      if (!bVar1) {
        return false;
      }
      local_33 = local_31 << 4 | local_32;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)i,&local_33);
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool cmUuid::StringToBinaryImpl(std::string const& input,
                                std::vector<unsigned char>& output) const
{
  if (input.size() % 2) {
    return false;
  }

  for (size_t i = 0; i < input.size(); i += 2) {
    char c1 = 0;
    if (!IntFromHexDigit(input[i], c1)) {
      return false;
    }

    char c2 = 0;
    if (!IntFromHexDigit(input[i + 1], c2)) {
      return false;
    }

    output.push_back(char(c1 << 4 | c2));
  }

  return true;
}